

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<QByteArray,char>,QByteArray>
          (QByteArray *a,QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  size_t __n;
  size_t __n_00;
  long lVar4;
  char *__dest;
  long lVar5;
  
  pDVar2 = (a->d).d;
  lVar5 = (a->d).size;
  lVar4 = (b->b).d.size;
  lVar3 = (b->a).a.d.size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar5);
  }
  lVar5 = lVar4 + lVar3 + lVar5 + 1;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
            (pDVar2->super_QArrayData).alloc) - (long)((a->d).ptr + (a->d).size);
  }
  if (lVar4 < lVar5) {
    if (pDVar2 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar4 < lVar5) {
      lVar4 = lVar5;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar2->super_QArrayData).alloc) - (long)(a->d).ptr) < lVar4)) {
      lVar5 = (a->d).size;
      if (lVar4 < lVar5) {
        lVar4 = lVar5;
      }
      QByteArray::reallocData((longlong)a,(AllocationOption)lVar4);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  __dest = (a->d).ptr + (a->d).size;
  __n = (b->a).a.d.size;
  if (__n != 0) {
    memcpy(__dest,(b->a).a.d.ptr,__n);
  }
  __dest[__n] = (b->a).b;
  __n_00 = (b->b).d.size;
  if (__n_00 != 0) {
    memcpy(__dest + __n + 1,(b->b).d.ptr,__n_00);
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}